

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.cxx
# Opt level: O3

int __thiscall Fl_Widget::take_focus(Fl_Widget *this)

{
  int iVar1;
  Fl_Group *pFVar2;
  int iVar3;
  
  iVar3 = 0;
  if (((this->flags_ & 0x207) == 0x200) &&
     (iVar1 = (*this->_vptr_Fl_Widget[3])(this,6), pFVar2 = (Fl_Group *)Fl::focus_, iVar3 = 0,
     iVar1 != 0)) {
    for (; pFVar2 != (Fl_Group *)0x0; pFVar2 = (pFVar2->super_Fl_Widget).parent_) {
      if (pFVar2 == (Fl_Group *)this) goto LAB_00189bd6;
    }
    Fl::focus(this);
LAB_00189bd6:
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int Fl_Widget::take_focus() {
  if (!takesevents()) return 0;
  if (!visible_focus()) return 0;
  if (!handle(FL_FOCUS)) return 0; // see if it wants it
  if (contains(Fl::focus())) return 1; // it called Fl::focus for us
  Fl::focus(this);
  return 1;
}